

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

int JS_SetObjectData(JSContext *ctx,JSValue obj,JSValue val)

{
  JSValueUnion JVar1;
  ushort uVar2;
  int iVar3;
  JSValueUnion JVar4;
  JSValueUnion extraout_RAX;
  JSValueUnion extraout_RAX_00;
  JSValueUnion JVar5;
  JSValueUnion JVar6;
  JSValue JVar7;
  
  JVar5 = val.u;
  JVar6 = obj.u;
  JVar4.float64 = 2.12199579047121e-314;
  if ((int)obj.tag == -1) {
    uVar2 = *(ushort *)((long)JVar6.ptr + 6);
    JVar4._2_6_ = 0;
    JVar4.int32._0_2_ = uVar2;
    if ((uVar2 - 4 < 4) || (uVar2 == 10)) {
      JVar1 = *(JSValueUnion *)((long)JVar6.ptr + 0x30);
      JVar7 = *(JSValue *)((long)JVar6.ptr + 0x30);
      if ((0xfffffff4 < (uint)*(undefined8 *)((long)JVar6.ptr + 0x38)) &&
         (iVar3 = *JVar1.ptr, *(int *)JVar1.ptr = iVar3 + -1, JVar4 = JVar1, iVar3 < 2)) {
        __JS_FreeValueRT(ctx->rt,JVar7);
        JVar4 = extraout_RAX;
      }
      *(JSValueUnion *)((long)JVar6.ptr + 0x30) = JVar5;
      *(int64_t *)((long)JVar6.ptr + 0x38) = val.tag;
      return JVar4.int32;
    }
  }
  if ((0xfffffff4 < (uint)val.tag) &&
     (iVar3 = *JVar5.ptr, *(int *)JVar5.ptr = iVar3 + -1, JVar4 = JVar5, iVar3 < 2)) {
    __JS_FreeValueRT(ctx->rt,val);
    JVar4 = extraout_RAX_00;
  }
  if ((int)obj.tag == 6) {
    return JVar4.int32;
  }
  JVar7 = JS_ThrowTypeError(ctx,"invalid object type");
  return JVar7.u._0_4_;
}

Assistant:

static int JS_SetObjectData(JSContext *ctx, JSValueConst obj, JSValue val)
{
    JSObject *p;

    if (JS_VALUE_GET_TAG(obj) == JS_TAG_OBJECT) {
        p = JS_VALUE_GET_OBJ(obj);
        switch(p->class_id) {
        case JS_CLASS_NUMBER:
        case JS_CLASS_STRING:
        case JS_CLASS_BOOLEAN:
        case JS_CLASS_SYMBOL:
        case JS_CLASS_DATE:
#ifdef CONFIG_BIGNUM
        case JS_CLASS_BIG_INT:
        case JS_CLASS_BIG_FLOAT:
        case JS_CLASS_BIG_DECIMAL:
#endif
            JS_FreeValue(ctx, p->u.object_data);
            p->u.object_data = val;
            return 0;
        }
    }
    JS_FreeValue(ctx, val);
    if (!JS_IsException(obj))
        JS_ThrowTypeError(ctx, "invalid object type");
    return -1;
}